

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool Catch::isDebuggerActive(void)

{
  int iVar1;
  char cVar2;
  int iVar3;
  int *piVar4;
  istream *piVar5;
  bool bVar6;
  string line;
  ifstream in;
  undefined1 *local_258;
  ulong local_250;
  undefined1 local_248;
  undefined7 uStack_247;
  istream local_238;
  
  piVar4 = __errno_location();
  iVar1 = *piVar4;
  std::ifstream::ifstream(&local_238,"/proc/self/status",_S_in);
  local_250 = 0;
  local_248 = 0;
  local_258 = &local_248;
  do {
    cVar2 = std::ios::widen((char)local_238._vptr_basic_istream[-3] + (char)&local_238);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (&local_238,(string *)&local_258,cVar2);
    if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) != 0) goto LAB_007c1998;
    iVar3 = std::__cxx11::string::compare((ulong)&local_258,0,&DAT_0000000b);
  } while (iVar3 != 0);
  if (local_250 < 0xc) {
LAB_007c1998:
    bVar6 = false;
  }
  else {
    bVar6 = local_258[0xb] != '0';
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
  std::ifstream::~ifstream(&local_238);
  *piVar4 = iVar1;
  return bVar6;
}

Assistant:

ErrnoGuard::~ErrnoGuard() { errno = m_oldErrno; }